

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O2

bool __thiscall cmArchiveWrite::AddData(cmArchiveWrite *this,char *file,size_t size)

{
  size_t sVar1;
  size_t s;
  bool bVar2;
  char *file_local;
  string local_4280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4260;
  ifstream fin;
  size_t local_4238;
  byte abStack_4220 [488];
  char buffer [16384];
  
  file_local = file;
  std::ifstream::ifstream(&fin,file,_S_in|_S_bin);
  if ((abStack_4220[*(long *)(_fin + -0x18)] & 5) == 0) {
    do {
      bVar2 = size == 0;
      if (bVar2) goto LAB_001204b4;
      s = 0x4000;
      if (size < 0x4000) {
        s = size;
      }
      std::istream::read((char *)&fin,(long)buffer);
      if (local_4238 != s) {
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        cmStrCat<char_const(&)[16],char_const*&,char_const(&)[4],std::__cxx11::string>
                  (&local_4260,(char (*) [16])"Error reading \"",&file_local,(char (*) [4])"\": ",
                   &local_4280);
        goto LAB_0012048e;
      }
      sVar1 = archive_write_data(this->Archive,buffer,s);
      size = size - s;
    } while (sVar1 == s);
    cm_archive_error_string_abi_cxx11_(&local_4280,this->Archive);
    cmStrCat<char_const(&)[21],std::__cxx11::string>
              (&local_4260,(char (*) [21])"archive_write_data: ",&local_4280);
LAB_0012048e:
    std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_4260);
    std::__cxx11::string::~string((string *)&local_4260);
    std::__cxx11::string::~string((string *)&local_4280);
  }
  else {
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    cmStrCat<char_const(&)[16],char_const*&,char_const(&)[4],std::__cxx11::string>
              ((string *)buffer,(char (*) [16])"Error opening \"",&file_local,(char (*) [4])"\": ",
               &local_4260);
    std::__cxx11::string::operator=((string *)&this->Error,(string *)buffer);
    std::__cxx11::string::~string((string *)buffer);
    std::__cxx11::string::~string((string *)&local_4260);
    bVar2 = false;
  }
LAB_001204b4:
  std::ifstream::~ifstream(&fin);
  return bVar2;
}

Assistant:

bool cmArchiveWrite::AddData(const char* file, size_t size)
{
  cmsys::ifstream fin(file, std::ios::in | std::ios::binary);
  if (!fin) {
    this->Error = cmStrCat("Error opening \"", file,
                           "\": ", cmSystemTools::GetLastSystemError());
    return false;
  }

  char buffer[16384];
  size_t nleft = size;
  while (nleft > 0) {
    using ssize_type = std::streamsize;
    size_t const nnext = nleft > sizeof(buffer) ? sizeof(buffer) : nleft;
    ssize_type const nnext_s = static_cast<ssize_type>(nnext);
    fin.read(buffer, nnext_s);
    // Some stream libraries (older HPUX) return failure at end of
    // file on the last read even if some data were read.  Check
    // gcount instead of trusting the stream error status.
    if (static_cast<size_t>(fin.gcount()) != nnext) {
      break;
    }
    if (archive_write_data(this->Archive, buffer, nnext) != nnext_s) {
      this->Error = cmStrCat("archive_write_data: ",
                             cm_archive_error_string(this->Archive));
      return false;
    }
    nleft -= nnext;
  }
  if (nleft > 0) {
    this->Error = cmStrCat("Error reading \"", file,
                           "\": ", cmSystemTools::GetLastSystemError());
    return false;
  }
  return true;
}